

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall
glu::sl::ShaderParser::parseImport
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  Archive *archive;
  ShaderParser *this_00;
  allocator<char> local_181;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> importedCases;
  string importFileName;
  FilePath local_140;
  FilePath local_120;
  string local_100;
  FilePath local_e0;
  FilePath local_c0;
  ShaderParser subParser;
  
  importFileName._M_dataplus._M_p = (pointer)&importFileName.field_2;
  importFileName._M_string_length = 0;
  importFileName.field_2._M_local_buf[0] = '\0';
  advanceToken(this,TOKEN_IMPORT);
  this_00 = (ShaderParser *)0x2;
  assumeToken(this,TOKEN_STRING);
  parseStringLiteral_abi_cxx11_((string *)&subParser,this_00,(this->m_curTokenStr)._M_dataplus._M_p)
  ;
  std::__cxx11::string::operator=((string *)&importFileName,(string *)&subParser);
  std::__cxx11::string::~string((string *)&subParser);
  advanceToken(this,TOKEN_STRING);
  archive = this->m_archive;
  std::__cxx11::string::string((string *)&local_120,(string *)&this->m_filename);
  de::FilePath::getDirName_abi_cxx11_(&local_100,&local_120);
  std::__cxx11::string::string((string *)&local_e0,(string *)&local_100);
  std::__cxx11::string::string((string *)&local_140,(string *)&importFileName);
  de::FilePath::join(&local_c0,&local_e0,&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&importedCases,local_c0.m_path._M_dataplus._M_p,&local_181);
  ShaderParser(&subParser,archive,(string *)&importedCases,this->m_caseFactory);
  std::__cxx11::string::~string((string *)&importedCases);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  parse(&importedCases,&subParser);
  std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::
  insert<__gnu_cxx::__normal_iterator<tcu::TestNode*const*,std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>>,void>
            ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
             (const_iterator)
             (shaderNodeList->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>)
             ._M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<tcu::TestNode_*const_*,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
              )importedCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<tcu::TestNode_*const_*,_std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>_>
              )importedCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&importedCases.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  ~ShaderParser(&subParser);
  std::__cxx11::string::~string((string *)&importFileName);
  return;
}

Assistant:

void ShaderParser::parseImport (vector<tcu::TestNode*>& shaderNodeList)
{
	std::string	importFileName;

	advanceToken(TOKEN_IMPORT);

	assumeToken(TOKEN_STRING);
	importFileName = parseStringLiteral(m_curTokenStr.c_str());
	advanceToken(TOKEN_STRING);

	{
		ShaderParser					subParser		(m_archive, de::FilePath::join(de::FilePath(m_filename).getDirName(), importFileName).getPath(), m_caseFactory);
		const vector<tcu::TestNode*>	importedCases = subParser.parse();

		// \todo [2015-08-03 pyry] Not exception safe
		shaderNodeList.insert(shaderNodeList.end(), importedCases.begin(), importedCases.end());
	}
}